

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSnapObjects.cpp
# Opt level: O3

void TTD::NSSnapObjects::ParseAddtlInfo_SnapPromiseInfo
               (SnapObject *snpObject,FileReader *reader,SlabAllocator *alloc)

{
  uint32 uVar1;
  int iVar2;
  uint32 *puVar3;
  TTDVar pvVar4;
  SnapPromiseReactionInfo *pSVar5;
  ulong uVar6;
  long lVar7;
  
  puVar3 = (uint32 *)SlabAllocatorBase<0>::SlabAllocateTypeRawSize<48ul>(alloc);
  uVar1 = FileReader::ReadUInt32(reader,u32Val,true);
  *puVar3 = uVar1;
  iVar2 = (*reader->_vptr_FileReader[10])(reader,10,1);
  *(char *)(puVar3 + 1) = (char)iVar2;
  (*reader->_vptr_FileReader[3])(reader,6,1);
  pvVar4 = NSSnapValues::ParseTTDVar(false,reader);
  *(TTDVar *)(puVar3 + 2) = pvVar4;
  uVar1 = FileReader::ReadLengthValue(reader,true);
  puVar3[4] = uVar1;
  puVar3[6] = 0;
  puVar3[7] = 0;
  FileReader::ReadSequenceStart_WDefaultKey(reader,true);
  if ((ulong)puVar3[4] != 0) {
    pSVar5 = SlabAllocatorBase<0>::SlabAllocateArray<TTD::NSSnapValues::SnapPromiseReactionInfo>
                       (alloc,(ulong)puVar3[4]);
    *(SnapPromiseReactionInfo **)(puVar3 + 6) = pSVar5;
    if (puVar3[4] != 0) {
      lVar7 = 0;
      uVar6 = 0;
      do {
        NSSnapValues::ParsePromiseReactionInfo
                  ((SnapPromiseReactionInfo *)(*(long *)(puVar3 + 6) + lVar7),uVar6 != 0,reader,
                   alloc);
        uVar6 = uVar6 + 1;
        lVar7 = lVar7 + 0x30;
      } while (uVar6 < puVar3[4]);
    }
  }
  (*reader->_vptr_FileReader[5])(reader);
  uVar1 = FileReader::ReadLengthValue(reader,true);
  puVar3[8] = uVar1;
  puVar3[10] = 0;
  puVar3[0xb] = 0;
  FileReader::ReadSequenceStart_WDefaultKey(reader,true);
  if ((ulong)puVar3[8] != 0) {
    pSVar5 = SlabAllocatorBase<0>::SlabAllocateArray<TTD::NSSnapValues::SnapPromiseReactionInfo>
                       (alloc,(ulong)puVar3[8]);
    *(SnapPromiseReactionInfo **)(puVar3 + 10) = pSVar5;
    if (puVar3[8] != 0) {
      lVar7 = 0;
      uVar6 = 0;
      do {
        NSSnapValues::ParsePromiseReactionInfo
                  ((SnapPromiseReactionInfo *)(*(long *)(puVar3 + 10) + lVar7),uVar6 != 0,reader,
                   alloc);
        uVar6 = uVar6 + 1;
        lVar7 = lVar7 + 0x30;
      } while (uVar6 < puVar3[8]);
    }
  }
  (*reader->_vptr_FileReader[5])(reader);
  if (snpObject->SnapObjectTag == SnapPromiseObject) {
    snpObject->AddtlSnapObjectInfo = puVar3;
    return;
  }
  TTDAbort_unrecoverable_error("Tag does not match.");
}

Assistant:

void ParseAddtlInfo_SnapPromiseInfo(SnapObject* snpObject, FileReader* reader, SlabAllocator& alloc)
        {
            SnapPromiseInfo* promiseInfo = alloc.SlabAllocateStruct<SnapPromiseInfo>();

            promiseInfo->Status = reader->ReadUInt32(NSTokens::Key::u32Val, true);
            promiseInfo->isHandled = reader->ReadBool(NSTokens::Key::boolVal, true);

            reader->ReadKey(NSTokens::Key::resultValue, true);
            promiseInfo->Result = NSSnapValues::ParseTTDVar(false, reader);

            promiseInfo->ResolveReactionCount = reader->ReadLengthValue(true);
            promiseInfo->ResolveReactions = nullptr;
            reader->ReadSequenceStart_WDefaultKey(true);
            if(promiseInfo->ResolveReactionCount != 0)
            {
                promiseInfo->ResolveReactions = alloc.SlabAllocateArray<NSSnapValues::SnapPromiseReactionInfo>(promiseInfo->ResolveReactionCount);

                for(uint32 i = 0; i < promiseInfo->ResolveReactionCount; ++i)
                {
                    NSSnapValues::ParsePromiseReactionInfo(promiseInfo->ResolveReactions + i, i != 0, reader, alloc);
                }
            }
            reader->ReadSequenceEnd();

            promiseInfo->RejectReactionCount = reader->ReadLengthValue(true);
            promiseInfo->RejectReactions = nullptr;
            reader->ReadSequenceStart_WDefaultKey(true);
            if(promiseInfo->RejectReactionCount != 0)
            {
                promiseInfo->RejectReactions = alloc.SlabAllocateArray<NSSnapValues::SnapPromiseReactionInfo>(promiseInfo->RejectReactionCount);

                for(uint32 i = 0; i < promiseInfo->RejectReactionCount; ++i)
                {
                    NSSnapValues::ParsePromiseReactionInfo(promiseInfo->RejectReactions + i, i != 0, reader, alloc);
                }
            }
            reader->ReadSequenceEnd();

            SnapObjectSetAddtlInfoAs<SnapPromiseInfo*, SnapObjectType::SnapPromiseObject>(snpObject, promiseInfo);
        }